

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O2

string * __thiscall
Catch::Detail::
rangeToString<std::basic_string_view<wchar_t,std::char_traits<wchar_t>>const*,std::basic_string_view<wchar_t,std::char_traits<wchar_t>>const*>
          (string *__return_storage_ptr__,Detail *this,
          basic_string_view<wchar_t,_std::char_traits<wchar_t>_> *first,
          basic_string_view<wchar_t,_std::char_traits<wchar_t>_> *last)

{
  basic_string_view<wchar_t,_std::char_traits<wchar_t>_> *e;
  basic_string_view<wchar_t,_std::char_traits<wchar_t>_> *e_00;
  basic_string_view<wchar_t,_std::char_traits<wchar_t>_> *this_00;
  ostream *poVar1;
  ReusableStringStream rss;
  ReusableStringStream RStack_68;
  string local_50;
  
  ReusableStringStream::ReusableStringStream(&RStack_68);
  poVar1 = RStack_68.m_oss;
  std::operator<<(RStack_68.m_oss,"{ ");
  if ((basic_string_view<wchar_t,_std::char_traits<wchar_t>_> *)this != first) {
    stringify<std::basic_string_view<wchar_t,std::char_traits<wchar_t>>>(&local_50,this,e);
    std::operator<<(poVar1,(string *)&local_50);
    std::__cxx11::string::~string((string *)&local_50);
    for (this_00 = (basic_string_view<wchar_t,_std::char_traits<wchar_t>_> *)(this + 0x10);
        this_00 != first; this_00 = this_00 + 1) {
      std::operator<<(poVar1,", ");
      stringify<std::basic_string_view<wchar_t,std::char_traits<wchar_t>>>
                (&local_50,(Detail *)this_00,e_00);
      poVar1 = RStack_68.m_oss;
      std::operator<<(RStack_68.m_oss,(string *)&local_50);
      std::__cxx11::string::~string((string *)&local_50);
    }
  }
  std::operator<<(poVar1," }");
  std::__cxx11::stringbuf::str();
  ReusableStringStream::~ReusableStringStream(&RStack_68);
  return __return_storage_ptr__;
}

Assistant:

std::string rangeToString(InputIterator first, Sentinel last) {
            ReusableStringStream rss;
            rss << "{ ";
            if (first != last) {
                rss << ::Catch::Detail::stringify(*first);
                for (++first; first != last; ++first)
                    rss << ", " << ::Catch::Detail::stringify(*first);
            }
            rss << " }";
            return rss.str();
        }